

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_bddGetOneCube(DdManager *dd,DdNode *bFunc)

{
  uint *puVar1;
  DdNode *pDVar2;
  DdManager *local_50;
  DdNode *bRes;
  DdNode *bRes1;
  DdNode *bRes0;
  DdNode *bFunc1;
  DdNode *bFunc0;
  DdNode *bFuncR;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  puVar1 = (uint *)((ulong)bFunc & 0xfffffffffffffffe);
  dd_local = (DdManager *)bFunc;
  if (*puVar1 != 0x7fffffff) {
    if (((ulong)bFunc & 1) == 0) {
      bFunc1 = *(DdNode **)(puVar1 + 6);
      bRes0 = *(DdNode **)(puVar1 + 4);
    }
    else {
      bFunc1 = (DdNode *)(*(ulong *)(puVar1 + 6) ^ 1);
      bRes0 = (DdNode *)(*(ulong *)(puVar1 + 4) ^ 1);
    }
    pDVar2 = Extra_bddGetOneCube(dd,bFunc1);
    Cudd_Ref(pDVar2);
    if (pDVar2 == (DdNode *)((ulong)dd->one ^ 1)) {
      Cudd_RecursiveDeref(dd,pDVar2);
      pDVar2 = Extra_bddGetOneCube(dd,bRes0);
      Cudd_Ref(pDVar2);
      if (pDVar2 == (DdNode *)((ulong)dd->one ^ 1)) {
        __assert_fail("bRes1 != b0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                      ,0x2a7,"DdNode *Extra_bddGetOneCube(DdManager *, DdNode *)");
      }
      local_50 = (DdManager *)Cudd_bddAnd(dd,pDVar2,dd->vars[*puVar1]);
      Cudd_Ref((DdNode *)local_50);
      Cudd_RecursiveDeref(dd,pDVar2);
    }
    else {
      local_50 = (DdManager *)Cudd_bddAnd(dd,pDVar2,(DdNode *)((ulong)dd->vars[*puVar1] ^ 1));
      Cudd_Ref((DdNode *)local_50);
      Cudd_RecursiveDeref(dd,pDVar2);
    }
    Cudd_Deref(&local_50->sentinel);
    dd_local = local_50;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Extra_bddGetOneCube( DdManager * dd, DdNode * bFunc )
{
    DdNode * bFuncR, * bFunc0, * bFunc1;
    DdNode * bRes0,  * bRes1,  * bRes;

    bFuncR = Cudd_Regular(bFunc);
    if ( cuddIsConstant(bFuncR) )
        return bFunc;

    // cofactor
    if ( Cudd_IsComplement(bFunc) )
    {
        bFunc0 = Cudd_Not( cuddE(bFuncR) );
        bFunc1 = Cudd_Not( cuddT(bFuncR) );
    }
    else
    {
        bFunc0 = cuddE(bFuncR);
        bFunc1 = cuddT(bFuncR);
    }

    // try to find the cube with the negative literal
    bRes0 = Extra_bddGetOneCube( dd, bFunc0 );  Cudd_Ref( bRes0 );

    if ( bRes0 != b0 )
    {
        bRes = Cudd_bddAnd( dd, bRes0, Cudd_Not(dd->vars[bFuncR->index]) ); Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bRes0 );
    }
    else
    {
        Cudd_RecursiveDeref( dd, bRes0 );
        // try to find the cube with the positive literal
        bRes1 = Extra_bddGetOneCube( dd, bFunc1 );  Cudd_Ref( bRes1 );
        assert( bRes1 != b0 );
        bRes = Cudd_bddAnd( dd, bRes1, dd->vars[bFuncR->index] ); Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bRes1 );
    }

    Cudd_Deref( bRes );
    return bRes;
}